

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool is_label)

{
  SymbolSet *set;
  long *plVar1;
  string *c_name;
  long *plVar2;
  string *unique;
  byte bVar3;
  char *pcVar4;
  string_view sVar5;
  string_view name_00;
  string_view proposed_name;
  string_view wasm_name;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  c_name = (string *)name._M_str;
  sVar5._M_str = (anon_unknown_0 *)name._M_len;
  bVar3 = is_label | 0x6c;
  sVar5._M_len = (size_t)c_name;
  sVar5 = anon_unknown_0::StripLeadingDollar(sVar5._M_str,sVar5);
  name_00._M_len = sVar5._M_str;
  name_00._M_str = (char *)0x0;
  Mangle_abi_cxx11_(&local_50,(CWriter *)sVar5._M_len,name_00,is_label);
  pcVar4 = (char *)0x4;
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1e2d3c);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  set = (SymbolSet *)plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  proposed_name._M_str = pcVar4;
  proposed_name._M_len = (size_t)local_70;
  anon_unknown_0::CWriter::FindUniqueName
            (__return_storage_ptr__,(CWriter *)(this + 0x150),set,proposed_name);
  wasm_name._M_str = (char *)__return_storage_ptr__;
  wasm_name._M_len = (size_t)c_name;
  anon_unknown_0::CWriter::ClaimName
            ((CWriter *)(this + 0x150),(SymbolSet *)(this + 0x90),(SymbolMap *)(ulong)bVar3,
             (char)name._M_len,wasm_name,c_name);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineLocalScopeName(std::string_view name,
                                          bool is_label) {
  return ClaimUniqueName(local_syms_, local_sym_map_,
                         is_label ? kLabelSuffix : kParamSuffix, name,
                         kSymbolPrefix + MangleName(StripLeadingDollar(name)));
}